

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.h
# Opt level: O2

ostream * cppqc::printInput<std::vector<int,std::allocator<int>>>
                    (ostream *out,tuple<std::vector<int,_std::allocator<int>_>_> *in)

{
  ostream *poVar1;
  ostream *poVar2;
  vector<int,_std::allocator<int>_> *x;
  string sStack_38;
  
  poVar1 = std::operator<<((ostream *)out,"  0: ");
  PrettyPrint<std::vector<int,std::allocator<int>>>::toString_abi_cxx11_
            (&sStack_38,(PrettyPrint<std::vector<int,std::allocator<int>>> *)in,x);
  poVar1 = std::operator<<(poVar1,(string *)&sStack_38);
  std::operator<<(poVar1,'\n');
  poVar2 = (ostream *)std::ostream::flush();
  std::__cxx11::string::~string((string *)&sStack_38);
  return poVar2;
}

Assistant:

std::ostream& printInput(std::ostream& out, const std::tuple<T0>& in) {
  return out << "  0: " << prettyPrint(std::get<0>(in)) << '\n' << std::flush;
}